

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeBreak
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index label,bool isConditional)

{
  Expression name_00;
  Break *pBVar1;
  Break *pBVar2;
  optional<wasm::Type> labelType_00;
  undefined1 auStack_f8 [8];
  Result<wasm::Name> name;
  undefined1 local_b0 [8];
  Result<wasm::Type> labelType;
  Result<wasm::Ok> _val_2;
  Break curr;
  
  getLabelName((Result<wasm::Name> *)auStack_f8,this,label,false);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
             ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_f8);
  if ((char)curr.name.super_IString.str._M_str == '\x01') {
    std::__cxx11::string::string
              ((string *)local_b0,
               (string *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    getLabelType((Result<wasm::Type> *)local_b0,this,label);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_b0);
    if ((char)curr.name.super_IString.str._M_str == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      pBVar2 = (Break *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)pBVar2);
      _val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x04';
      pBVar1 = (Break *)auStack_f8;
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
        pBVar1 = (Break *)0x0;
      }
      name_00 = (pBVar1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression;
      pBVar1 = (Break *)0x0;
      if (isConditional) {
        pBVar1 = pBVar2;
      }
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_b0;
      name.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = this;
      ChildPopper::visitBreak
                ((Result<wasm::Ok> *)
                 ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                 (ChildPopper *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),pBVar2,labelType_00);
      if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                   (string *)
                   ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&labelType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        pBVar2 = Builder::makeBreak(&this->builder,(Name)name_00,(Expression *)0x0,
                                    (Expression *)pBVar1);
        push(this,(Expression *)pBVar2);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_b0);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_f8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeBreak(Index label, bool isConditional) {
  auto name = getLabelName(label);
  CHECK_ERR(name);
  auto labelType = getLabelType(label);
  CHECK_ERR(labelType);

  Break curr;
  curr.name = *name;
  // Use a dummy condition value if we need to pop a condition.
  curr.condition = isConditional ? &curr : nullptr;
  CHECK_ERR(ChildPopper{*this}.visitBreak(&curr, *labelType));
  push(builder.makeBreak(curr.name, curr.value, curr.condition));
  return Ok{};
}